

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_table.hpp
# Opt level: O3

int __thiscall andyzip::huffman_table<258>::init(huffman_table<258> *this,EVP_PKEY_CTX *ctx)

{
  uint in_ECX;
  ulong uVar1;
  ulong uVar2;
  ushort *in_RDX;
  EVP_PKEY_CTX EVar3;
  int iVar4;
  uint uVar5;
  EVP_PKEY_CTX EVar6;
  EVP_PKEY_CTX EVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  this->invalid_ = true;
  if (in_ECX == 2) {
    this->min_length_ = '\x01';
    this->max_length_ = '\x01';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    this->symbols_[0] = *in_RDX;
    uVar1 = (ulong)in_RDX[1];
    this->symbols_[1] = in_RDX[1];
  }
  else if (in_ECX == 1) {
    this->min_length_ = '\0';
    this->max_length_ = '\0';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    uVar1 = (ulong)*in_RDX;
    this->symbols_[0] = *in_RDX;
  }
  else {
    this->min_length_ = '\x10';
    this->max_length_ = '\0';
    if (in_ECX == 0) {
      return 0;
    }
    EVar7 = (EVP_PKEY_CTX)0x10;
    uVar1 = 0;
    EVar6 = (EVP_PKEY_CTX)0x0;
    do {
      EVar3 = ctx[uVar1];
      if (EVar3 != (EVP_PKEY_CTX)0x0) {
        if ((byte)EVar3 < (byte)EVar7) {
          this->min_length_ = (uint8_t)EVar3;
          EVar7 = EVar3;
          EVar3 = ctx[uVar1];
        }
        if ((byte)EVar6 < (byte)EVar3) {
          this->max_length_ = (uint8_t)EVar3;
          EVar6 = EVar3;
        }
      }
      uVar1 = uVar1 + 1;
    } while (in_ECX != uVar1);
    if (EVar7 == (EVP_PKEY_CTX)0x0) {
      return in_ECX;
    }
    if (0x10 < (byte)EVar6 || (byte)EVar6 < (byte)EVar7) {
      return in_ECX;
    }
    uVar1 = (ulong)(byte)EVar7;
    iVar4 = 0;
    uVar5 = 0;
    uVar11 = uVar1;
    do {
      *(short *)((long)this + (uVar11 - uVar1) * 2 + 0x22a) = (short)iVar4 - (short)uVar5;
      if (in_ECX != 0) {
        uVar2 = 0;
        do {
          if (uVar11 == (byte)ctx[uVar2]) {
            if (in_RDX == (ushort *)0x0) {
              uVar8 = (ushort)uVar2;
            }
            else {
              uVar8 = in_RDX[uVar2];
            }
            uVar10 = (ulong)uVar5;
            uVar5 = uVar5 + 1;
            this->symbols_[uVar10] = uVar8;
            iVar4 = iVar4 + 1;
          }
          uVar2 = uVar2 + 1;
        } while (in_ECX != uVar2);
      }
      uVar9 = (iVar4 << (0x10U - (char)uVar11 & 0x1f)) - 1;
      *(short *)((long)this + (uVar11 - uVar1) * 2 + 0x206) = (short)uVar9;
      if (0xffff < uVar9) {
        return in_ECX;
      }
      iVar4 = iVar4 * 2;
      uVar11 = uVar11 + 1;
    } while (uVar11 != (byte)((char)EVar6 + 1));
    uVar1 = ((ulong)(byte)EVar6 + 1) - uVar1;
    *(undefined2 *)((long)this + uVar1 * 2 + 0x206) = 0xffff;
  }
  this->invalid_ = false;
  return (int)uVar1;
}

Assistant:

void init(const uint8_t *lengths, const uint16_t *symbols, unsigned num_lengths) {
      invalid_ = true;

      if (num_lengths == 1) {
        min_length_ = 0;
        max_length_ = 0;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        invalid_ = false;
        return;
      }
      if (num_lengths == 2) {
        min_length_ = 1;
        max_length_ = 1;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        symbols_[1] = symbols[1];
        invalid_ = false;
        return;
      }

      min_length_ = 16;
      max_length_ = 0;
      for (unsigned i = 0; i != num_lengths; ++i) {
        if (lengths[i]) {
          if (min_length_ > lengths[i]) min_length_ = lengths[i];
          if (max_length_ < lengths[i]) max_length_ = lengths[i];
        }
      }

      if ( min_length_ <= 0 || min_length_ > max_length_ || max_length_ > 16 ) {
        return;
      }

      unsigned code = 0;
      unsigned huffcode = 0;
      for (unsigned length = min_length_; length <= max_length_; ++length) {
        base_[length-min_length_] = huffcode - code;
        for (unsigned i = 0; i != num_lengths; ++i) {
          if (lengths[i] == length) {
            symbols_[code++] = symbols ? symbols[i] : i;
            huffcode++;
          }
        }
        limits_[length-min_length_] = (uint16_t)( ( huffcode << (16-length) ) - 1 );
        if (( huffcode << (16-length) ) - 1 > 0xffff) {
          return;
        }
        huffcode *= 2;
      }

      // prevent escape from bitstream decoding loop.
      limits_[max_length_+1-min_length_] = 0xffff;
      invalid_ = false;
    }